

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall
CircularArrayTest_const_operator_brackets_Test::TestBody
          (CircularArrayTest_const_operator_brackets_Test *this)

{
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_80;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  TestObject local_4c;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> *local_40;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> *cca;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  CircularArrayTest_const_operator_brackets_Test *this_local;
  
  ca.front_ = (size_type)this;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
  local_40 = (CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca;
  anon_unknown.dwarf_f66d::TestObject::TestObject(&local_4c,1,0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca,&local_4c);
  anon_unknown.dwarf_f66d::TestObject::~TestObject(&local_4c);
  anon_unknown.dwarf_f66d::TestObject::TestObject((TestObject *)&gtest_ar.message_,2,0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca,
             (value_type *)&gtest_ar.message_);
  anon_unknown.dwarf_f66d::TestObject::~TestObject((TestObject *)&gtest_ar.message_);
  local_6c = 1;
  pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::operator[](local_40,0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_68,"1","cca[0].data",&local_6c,&pvVar2->data);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_9c = 2;
    pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::operator[](local_40,1);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_98,"2","cca[1].data",&local_9c,&pvVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                 ,0x98,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::Message::~Message(&local_a8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&cca);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_operator_brackets) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, cca[0].data);
  ASSERT_EQ(2, cca[1].data);
}